

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionTest.cpp
# Opt level: O2

void __thiscall
AssertionTest_assertNeHandlerShouldNotBeCalled_Test::TestBody
          (AssertionTest_assertNeHandlerShouldNotBeCalled_Test *this)

{
  int32_t *actual;
  ostream *poVar1;
  AssertionMessage *pAVar2;
  AssertionMessage *value1;
  char *pcVar3;
  AssertionMessage *in_stack_fffffffffffffdd8;
  int32_t b;
  int32_t a;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_218;
  AssertionMessage local_210;
  AssertionMessage local_208;
  string local_200;
  AssertionResult gtest_ar_1;
  stringstream expectedMsg;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  ostream local_190 [376];
  
  a = 0;
  b = 1;
  gtest_ar_1.success_ = false;
  gtest_ar_1._1_3_ = 0;
  actual = &(this->super_AssertionTest).assertionHandlerCounter_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&expectedMsg,"0","assertionHandlerCounter_",(int *)&gtest_ar_1,actual);
  if (expectedMsg == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (local_198.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_198.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DariuszOstolski[P]cppassert/tests/AssertionTest.cpp"
               ,0x93,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_200,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_200);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&local_198);
  std::__cxx11::stringstream::stringstream((stringstream *)&expectedMsg);
  poVar1 = std::operator<<(local_190,"Expected message: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,a);
  poVar1 = std::operator<<(poVar1," ");
  std::ostream::operator<<(poVar1,b);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_AssertionTest).expectedStreamMessage_,(string *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  if (a == b) {
    cppassert::internal::AssertionMessage::AssertionMessage((AssertionMessage *)&local_218);
    pAVar2 = cppassert::internal::AssertionMessage::operator<<((AssertionMessage *)&local_218,&a);
    cppassert::internal::AssertionMessage::AssertionMessage(&local_208);
    value1 = cppassert::internal::AssertionMessage::operator<<(&local_208,&b);
    cppassert::internal::getPredicateAssertionFailureMessage_abi_cxx11_
              (&local_200,(internal *)"!=","a","b",(char *)pAVar2,value1,in_stack_fffffffffffffdd8);
    cppassert::AssertionFailure::AssertionFailure
              ((AssertionFailure *)&gtest_ar_1,0x96,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DariuszOstolski[P]cppassert/tests/AssertionTest.cpp"
               ,"virtual void AssertionTest_assertNeHandlerShouldNotBeCalled_Test::TestBody()",
               &local_200);
    cppassert::internal::AssertionMessage::AssertionMessage(&local_210);
    pAVar2 = cppassert::internal::AssertionMessage::operator<<
                       (&local_210,(char (*) [19])"Expected message: ");
    pAVar2 = cppassert::internal::AssertionMessage::operator<<(pAVar2,&a);
    pAVar2 = cppassert::internal::AssertionMessage::operator<<(pAVar2,(char (*) [2])0x160eee);
    pAVar2 = cppassert::internal::AssertionMessage::operator<<(pAVar2,&b);
    cppassert::AssertionFailure::onAssertionFailure((AssertionFailure *)&gtest_ar_1,pAVar2);
    if (local_210.stream_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_210.stream_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
    cppassert::AssertionFailure::~AssertionFailure((AssertionFailure *)&gtest_ar_1);
    std::__cxx11::string::~string((string *)&local_200);
    if (local_208.stream_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_208.stream_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
    if (local_218._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_218._M_head_impl + 8))();
    }
  }
  local_200._M_dataplus._M_p._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_1,"0","assertionHandlerCounter_",(int *)&local_200,actual);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_200);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DariuszOstolski[P]cppassert/tests/AssertionTest.cpp"
               ,0x97,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_218,(Message *)&local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_218);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_200);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  std::__cxx11::stringstream::~stringstream((stringstream *)&expectedMsg);
  return;
}

Assistant:

TEST_F(AssertionTest, assertNeHandlerShouldNotBeCalled)
{
    std::int32_t a = 0;
    std::int32_t b = 1;
    CPP_ASSERT_NE(a, b);
    EXPECT_EQ(0, assertionHandlerCounter_);

    SET_EXPECTED_MSG(a, b);
    CPP_ASSERT_NE(a, b, EXPECTED_TEST_MSG(a,b));
    EXPECT_EQ(0, assertionHandlerCounter_);
}